

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyalloc.c
# Opt level: O1

void tommy_allocator_done(tommy_allocator *alloc)

{
  long lVar1;
  tommy_allocator_entry_struct *ptVar2;
  tommy_allocator_entry_struct *ptr;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = alloc->used_segment;
  while (ptr != (tommy_allocator_entry_struct *)0x0) {
    ptVar2 = ptr->next;
    lrtr_free(ptr);
    ptr = ptVar2;
  }
  alloc->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  alloc->free_block = (tommy_allocator_entry_struct *)0x0;
  alloc->used_segment = (tommy_allocator_entry_struct *)0x0;
  return;
}

Assistant:

void tommy_allocator_done(tommy_allocator* alloc)
{
	allocator_reset(alloc);
}